

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_cache.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::stat_cache::set_cache_impl(stat_cache *this,file_index_t i,int64_t size)

{
  value_type local_20;
  
  if ((int)((ulong)((long)(this->m_stat_cache).
                          super_vector<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
                          .
                          super__Vector_base<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_stat_cache).
                         super_vector<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
                         .
                         super__Vector_base<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) <= i.m_val) {
    local_20.file_size = -1;
    ::std::
    vector<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
    ::resize(&(this->m_stat_cache).
              super_vector<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
             ,(long)(i.m_val + 1),&local_20);
  }
  (this->m_stat_cache).
  super_vector<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
  .
  super__Vector_base<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
  ._M_impl.super__Vector_impl_data._M_start[i.m_val].file_size = size;
  return;
}

Assistant:

void stat_cache::set_cache_impl(file_index_t const i, std::int64_t const size)
	{
		if (i >= m_stat_cache.end_index())
			m_stat_cache.resize(static_cast<int>(i) + 1, stat_cache_t{not_in_cache});
		m_stat_cache[i].file_size = size;
	}